

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall draco::Options::SetVector<float>(Options *this,string *name,float *vec,int num_dims)

{
  mapped_type *this_00;
  int in_ECX;
  int i;
  string out;
  undefined8 in_stack_ffffffffffffff78;
  string local_78 [48];
  undefined4 in_stack_ffffffffffffffb8;
  int iVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0);
  for (iVar1 = 0; iVar1 < in_ECX; iVar1 = iVar1 + 1) {
    if (0 < iVar1) {
      std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0," ");
    }
    std::__cxx11::to_string((float)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffc0,local_78);
    std::__cxx11::string::~string(local_78);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffc0,
                         (key_type *)CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void Options::SetVector(const std::string &name, const DataTypeT *vec,
                        int num_dims) {
  std::string out;
  for (int i = 0; i < num_dims; ++i) {
    if (i > 0) {
      out += " ";
    }

// GNU STL on android doesn't include a proper std::to_string, but the libc++
// version does
#if defined(ANDROID) && !defined(_LIBCPP_VERSION)
    out += to_string(vec[i]);
#else
    out += std::to_string(vec[i]);
#endif
  }
  options_[name] = out;
}